

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqliteDefaultBusyCallback(void *ptr,int count)

{
  uint uVar1;
  int in_ESI;
  long in_RDI;
  int prior;
  int delay;
  int tmout;
  sqlite3 *db;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint local_28;
  int local_4;
  
  if (in_ESI < 0xc) {
    local_28 = (uint)"\x01\x02\x05\n\x0f\x14\x19\x19\x1922d"[in_ESI];
    uVar1 = (uint)""[in_ESI];
  }
  else {
    local_28 = 100;
    uVar1 = (in_ESI + -0xb) * 100 + 0xe4;
  }
  if ((*(int *)(in_RDI + 0x2e4) < (int)(uVar1 + local_28)) &&
     ((int)(*(int *)(in_RDI + 0x2e4) - uVar1) < 1)) {
    local_4 = 0;
  }
  else {
    sqlite3OsSleep((sqlite3_vfs *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int sqliteDefaultBusyCallback(
  void *ptr,               /* Database connection */
  int count                /* Number of times table has been busy */
){
#if SQLITE_OS_WIN || !defined(HAVE_NANOSLEEP) || HAVE_NANOSLEEP
  /* This case is for systems that have support for sleeping for fractions of
  ** a second.  Examples:  All windows systems, unix systems with nanosleep() */
  static const u8 delays[] =
     { 1, 2, 5, 10, 15, 20, 25, 25,  25,  50,  50, 100 };
  static const u8 totals[] =
     { 0, 1, 3,  8, 18, 33, 53, 78, 103, 128, 178, 228 };
# define NDELAY ArraySize(delays)
  sqlite3 *db = (sqlite3 *)ptr;
  int tmout = db->busyTimeout;
  int delay, prior;

  assert( count>=0 );
  if( count < NDELAY ){
    delay = delays[count];
    prior = totals[count];
  }else{
    delay = delays[NDELAY-1];
    prior = totals[NDELAY-1] + delay*(count-(NDELAY-1));
  }
  if( prior + delay > tmout ){
    delay = tmout - prior;
    if( delay<=0 ) return 0;
  }
  sqlite3OsSleep(db->pVfs, delay*1000);
  return 1;
#else
  /* This case for unix systems that lack usleep() support.  Sleeping
  ** must be done in increments of whole seconds */
  sqlite3 *db = (sqlite3 *)ptr;
  int tmout = ((sqlite3 *)ptr)->busyTimeout;
  if( (count+1)*1000 > tmout ){
    return 0;
  }
  sqlite3OsSleep(db->pVfs, 1000000);
  return 1;
#endif
}